

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
trieste::PassDef::PassDef
          (PassDef *this,string *name,Wellformed *wf,flag direction,
          initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
          *r)

{
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  *pDVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  long lVar4;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *__tmp;
  undefined1 auVar5 [16];
  allocator_type local_41 [17];
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + name->_M_string_length);
  this->wf_ = wf;
  this->direction_ = direction;
  std::
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ::vector(&this->rules_,*r,local_41);
  pDVar1 = &this->rule_map;
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rule_map).def.def.
  super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rule_map).def.empty_ = true;
  auVar5._8_4_ = (int)pDVar1;
  auVar5._0_8_ = pDVar1;
  auVar5._12_4_ = (int)((ulong)pDVar1 >> 0x20);
  lVar4 = 0xc;
  do {
    *(undefined1 (*) [16])((this->rule_map).def.map._M_elems + lVar4 + -0xc) = auVar5;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x8c);
  (this->rule_map).empty_ = true;
  lVar4 = 0x8d;
  do {
    *(undefined1 (*) [16])((this->rule_map).def.map._M_elems + lVar4 + -0xc) = auVar5;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x10d);
  p_Var2 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pre_once).super__Function_base._M_functor = (_Any_data)0x0;
  *(undefined1 (*) [16])&(this->pre_once).super__Function_base._M_manager = (undefined1  [16])0x0;
  (this->post_once).super__Function_base._M_functor = (_Any_data)0x0;
  *(undefined1 (*) [16])&(this->post_once).super__Function_base._M_manager = (undefined1  [16])0x0;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->post_)._M_t._M_impl.super__Rb_tree_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compile_rules(this);
  return;
}

Assistant:

PassDef(
      const std::string& name,
      const wf::Wellformed& wf,
      dir::flag direction,
      const std::initializer_list<detail::PatternEffect<Node>>& r)
    : name_(name), wf_(wf), direction_(direction), rules_(r)
    {
      compile_rules();
    }